

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBufferCopy(StringRef InputData,Twine *BufferName)

{
  _func_int **pp_Var1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  __uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true> _Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  _func_int **local_30;
  unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> Buf;
  
  _Var2.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data
  ;
  WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)&local_30,(size_t)BufferName,
             (Twine *)CONCAT71(in_register_00000009,in_CL));
  pp_Var1 = local_30;
  if (local_30 == (_func_int **)0x0) {
    pp_Var4 = (_func_int **)0xc;
  }
  else {
    memcpy(local_30[1],(void *)InputData.Length,(size_t)BufferName);
    pp_Var4 = local_30;
    local_30 = (_func_int **)0x0;
  }
  if (local_30 != (_func_int **)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  if (pp_Var1 == (_func_int **)0x0) {
    *(undefined8 *)
     _Var2.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
     super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
     super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = 0;
    pp_Var5 = (_func_int **)0x0;
    pp_Var3 = pp_Var4;
  }
  else {
    pp_Var3 = (_func_int **)0x0;
    pp_Var5 = pp_Var4;
  }
  *(_func_int ***)
   _Var2.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
   super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
   super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = pp_Var5;
  if (pp_Var3 != (_func_int **)0x0 && pp_Var1 != (_func_int **)0x0) {
    (**(code **)(*pp_Var3 + 8))();
  }
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)
         _Var2.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>.
         _M_t.super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
         .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBufferCopy(StringRef InputData, const Twine &BufferName) {
  auto Buf = getMemBufferCopyImpl(InputData, BufferName);
  if (Buf)
    return std::move(*Buf);
  return nullptr;
}